

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status fdb_iterator_seek_to_max(fdb_iterator *iterator)

{
  fdb_kvs_handle *pfVar1;
  ulong uVar2;
  fdb_kvs_id_t fVar3;
  hbtrie_iterator *phVar4;
  hbtrie *trie;
  btree_iterator *pbVar5;
  btree *btree;
  kvs_info *pkVar6;
  wal_iterator *pwVar7;
  long lVar8;
  fdb_status fVar9;
  wal_item *pwVar10;
  uint64_t uVar11;
  long lVar12;
  ulong chunksize;
  void *buf;
  undefined8 uStack_f0;
  wal_item wStack_e8;
  wal_item_header wStack_68;
  ulong uStack_30;
  
  if ((iterator != (fdb_iterator *)0x0) && (iterator->handle != (fdb_kvs_handle *)0x0)) {
    if (iterator->hbtrie_iterator == (hbtrie_iterator *)0x0) {
      fVar9 = FDB_RESULT_INVALID_HANDLE;
      if (iterator != (fdb_iterator *)0x0) {
        pfVar1 = iterator->handle;
        if (pfVar1 != (fdb_kvs_handle *)0x0) {
          iterator->direction = '\x02';
          uVar2 = (iterator->field_12).end_seqnum;
          iterator->_seqnum = uVar2;
          chunksize = (ulong)(pfVar1->config).chunksize;
          lVar12 = chunksize + 8;
          lVar8 = -(ulong)((int)lVar12 + 0xfU & 0xfffffff0);
          buf = (void *)((long)&wStack_e8 + lVar8);
          uStack_30 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                      (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                      (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                      (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
          if (pfVar1->kvs == (kvs_info *)0x0) {
            pbVar5 = iterator->seqtree_iterator;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f2e9;
            btree_iterator_free(pbVar5);
            pbVar5 = iterator->seqtree_iterator;
            btree = (iterator->handle->field_6).seqtree;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f2fd;
            btree_iterator_init(btree,pbVar5,&uStack_30);
          }
          else {
            fVar3 = pfVar1->kvs->id;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f2b5;
            kvid2buf(chunksize,fVar3,buf);
            *(ulong *)((long)buf + chunksize) = uStack_30;
            phVar4 = iterator->seqtrie_iterator;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f2c6;
            hbtrie_iterator_free(phVar4);
            phVar4 = iterator->seqtrie_iterator;
            trie = (iterator->handle->field_6).seqtrie;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f2de;
            hbtrie_iterator_init(trie,phVar4,buf,0x10);
          }
          if ((iterator->field_12).end_seqnum == 0xffffffffffffffff) {
            pwVar7 = iterator->wal_itr;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f336;
            pwVar10 = wal_itr_last(pwVar7);
          }
          else {
            pkVar6 = iterator->handle->kvs;
            if (pkVar6 == (kvs_info *)0x0) {
              wStack_68.key = (void *)0x0;
              lVar12 = 0;
            }
            else {
              fVar3 = pkVar6->id;
              wStack_68.key = buf;
              *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f323;
              kvid2buf(chunksize,fVar3,buf);
              *(ulong *)((long)buf + chunksize) = uStack_30;
            }
            wStack_e8.header = &wStack_68;
            wStack_68.keylen = (uint16_t)lVar12;
            wStack_e8.seqnum = *(fdb_seqnum_t *)&iterator->field_12;
            pwVar7 = iterator->wal_itr;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f368;
            pwVar10 = wal_itr_search_smaller(pwVar7,&wStack_e8);
          }
          iterator->tree_cursor = pwVar10;
          if (((iterator->tree_cursor != (wal_item *)0x0) &&
              (iterator->tree_cursor->seqnum == (iterator->field_12).end_seqnum)) &&
             ((iterator->opt & 8) != 0)) {
            pwVar7 = iterator->wal_itr;
            *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f38e;
            pwVar10 = wal_itr_prev(pwVar7);
            iterator->tree_cursor = pwVar10;
          }
          pwVar10 = iterator->tree_cursor;
          if (pwVar10 == (wal_item *)0x0) {
            uVar11 = 0xffffffffffffffff;
          }
          else {
            uVar11 = pwVar10->offset;
          }
          iterator->_offset = uVar11;
          iterator->tree_cursor_prev = pwVar10;
          *(undefined8 *)((long)&uStack_f0 + lVar8) = 0x12f3bb;
          fVar9 = fdb_iterator_prev(iterator);
        }
      }
      return fVar9;
    }
    fVar9 = _fdb_iterator_seek_to_max_key(iterator);
    return fVar9;
  }
  return FDB_RESULT_INVALID_HANDLE;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_to_max(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status ret;
    LATENCY_STAT_START();

    if (!iterator->hbtrie_iterator) {
        ret = _fdb_iterator_seek_to_max_seq(iterator);
    } else {
        ret = _fdb_iterator_seek_to_max_key(iterator);
    }
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEEK_MAX);
    return ret;
}